

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::GcCompactTransientMiscBuffers(void)

{
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  ImVector<int>::clear(&GImGui->ItemFlagsStack);
  ImVector<ImGuiGroupData>::clear(&pIVar1->GroupStack);
  TableGcCompactSettings();
  return;
}

Assistant:

void ImGui::GcCompactTransientMiscBuffers()
{
    ImGuiContext& g = *GImGui;
    g.ItemFlagsStack.clear();
    g.GroupStack.clear();
    TableGcCompactSettings();
}